

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O2

void m565_converter(uchar *from,uchar *to,int w,int delta)

{
  unsigned_short *t;
  bool bVar1;
  long lStack_8;
  
  if (dir == 1) {
    from = from + (w + -1) * delta;
    to = to + (long)w * 2 + -2;
    delta = -delta;
    lStack_8 = -1;
  }
  else {
    lStack_8 = 1;
  }
  dir = dir ^ 1;
  while (bVar1 = w != 0, w = w + -1, bVar1) {
    ri = (uint)*from + (ri & 7U);
    if (0xfe < (uint)ri) {
      ri = 0xff;
    }
    *(short *)to = (short)((uint)ri >> 3) * 0x841;
    from = from + delta;
    to = (uchar *)((long)to + lStack_8 * 2);
  }
  return;
}

Assistant:

static void m565_converter(const uchar *from,uchar *to,int w, int delta) {
  OUTTYPE *t = (OUTTYPE *)to;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    t = t+(w-1)*OUTSIZE;
    d = -delta;
    td = -OUTSIZE;
  } else {
    dir = 1;
    d = delta;
    td = OUTSIZE;
  }
  int r=ri;
  for (; w--; from += d, t += td) {
    r = (r&7) + *from; if (r > 255) r = 255;
    OUTASSIGN((r>>3) * 0x841);
  }
  ri = r;
}